

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.hpp
# Opt level: O2

void __thiscall
libtorrent::torrent_info::rename_file(torrent_info *this,file_index_t index,string *new_filename)

{
  __type _Var1;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  file_storage::file_path(&local_48,&this->m_files,index,&local_68);
  _Var1 = std::operator==(&local_48,new_filename);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  if (!_Var1) {
    copy_on_write(this);
    file_storage::rename_file(&this->m_files,index,new_filename);
  }
  return;
}

Assistant:

void rename_file(file_index_t index, std::string const& new_filename)
		{
			TORRENT_ASSERT(is_loaded());
			if (m_files.file_path(index) == new_filename) return;
			copy_on_write();
			m_files.rename_file(index, new_filename);
		}